

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpCore.cpp
# Opt level: O0

shared_ptr<helics::helicsCLI11App> __thiscall helics::tcp::TcpCoreSS::generateCLI(TcpCoreSS *this)

{
  element_type *__s;
  Option *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<helics::helicsCLI11App> sVar1;
  shared_ptr<helics::helicsCLI11App> *hApp;
  string *in_stack_fffffffffffffe98;
  App *in_stack_fffffffffffffea0;
  allocator<char> *in_stack_fffffffffffffed0;
  allocator<char> *__a;
  char *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined1 value;
  Option *in_stack_ffffffffffffff10;
  NetworkCore<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0>
  *in_stack_ffffffffffffff28;
  allocator<char> local_c1 [40];
  allocator<char> local_99;
  string *in_stack_ffffffffffffff68;
  bool *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  App *in_stack_ffffffffffffff80;
  allocator<char> local_71 [9];
  string *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  App *in_stack_ffffffffffffffb0;
  allocator<char> local_39 [40];
  undefined1 local_11;
  
  local_11 = 0;
  NetworkCore<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0>::generateCLI
            (in_stack_ffffffffffffff28);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4b7b18);
  value = (undefined1)((ulong)local_39 >> 0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  CLI::App::description(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffea0);
  std::allocator<char>::~allocator(local_39);
  __s = CLI::std::
        __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x4b7b82);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,in_stack_fffffffffffffed0);
  __a = &local_99;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,__a);
  CLI::App::
  add_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffea0);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffea0);
  std::allocator<char>::~allocator(local_71);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4b7c50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,__a);
  this_00 = CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
                      (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70
                       ,in_stack_ffffffffffffff68);
  CLI::Option::ignore_underscore<CLI::App>(in_stack_ffffffffffffff10,(bool)value);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff17);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(local_c1);
  sVar1.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<helics::helicsCLI11App>)
         sVar1.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helicsCLI11App> TcpCoreSS::generateCLI()
    {
        auto hApp = NetworkCore::generateCLI();
        hApp->description("TCP Single Socket Core ");
        hApp->add_option("--connections", connections, "target link connections");
        hApp->add_flag("--no_outgoing_connection",
                       no_outgoing_connections,
                       "disable outgoing connections")
            ->ignore_underscore();
        return hApp;
    }